

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gls::(anonymous_namespace)::generateTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,AttribType *type,int arraySize
          )

{
  string *__lhs;
  bool bVar1;
  allocator<char> local_75 [20];
  byte local_61;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  _anonymous_namespace_ *p_Stack_18;
  int arraySize_local;
  AttribType *type_local;
  
  local_1c = (int)type;
  p_Stack_18 = this;
  type_local = (AttribType *)__return_storage_ptr__;
  __lhs = AttributeLocationTestUtil::AttribType::getName_abi_cxx11_((AttribType *)this);
  local_61 = 0;
  bVar1 = local_1c == -1;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",local_75);
  }
  else {
    de::toString<int>(&local_60,&local_1c);
    local_61 = 1;
    std::operator+(&local_40,"_array_",&local_60);
  }
  std::operator+(__return_storage_ptr__,__lhs,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    std::allocator<char>::~allocator(local_75);
  }
  if ((local_61 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

string generateTestName (const AttribType& type, int arraySize)
{
	return type.getName() + (arraySize != Attribute::NOT_ARRAY ? "_array_" + de::toString(arraySize) : "");
}